

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

MPP_RET mpp_enc_refs_get_cpb_info(MppEncRefs refs,MppEncCpbInfo *info)

{
  undefined8 uVar1;
  MppEncRefsImpl *p;
  MppEncCpbInfo *info_local;
  MppEncRefs refs_local;
  
  if ((refs == (MppEncRefs)0x0) || (info == (MppEncCpbInfo *)0x0)) {
    _mpp_log_l(2,"mpp_enc_refs","invalid input refs %p info %p\n","mpp_enc_refs_get_cpb_info",refs,
               info);
    refs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_get_cpb_info",refs);
    }
    uVar1 = *(undefined8 *)((long)refs + 0x40);
    info->dpb_size = (int)uVar1;
    info->max_lt_cnt = (int)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)((long)refs + 0x48);
    info->max_st_cnt = (int)uVar1;
    info->max_lt_idx = (int)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)((long)refs + 0x50);
    info->max_st_tid = (int)uVar1;
    info->lt_gop = (int)((ulong)uVar1 >> 0x20);
    info->st_gop = *(RK_S32 *)((long)refs + 0x58);
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_get_cpb_info",refs);
    }
    refs_local._4_4_ = MPP_OK;
  }
  return refs_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_refs_get_cpb_info(MppEncRefs refs, MppEncCpbInfo *info)
{
    if (NULL == refs || NULL == info) {
        mpp_err_f("invalid input refs %p info %p\n", refs, info);
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;
    memcpy(info, &p->cpb.info, sizeof(*info));

    enc_refs_dbg_func("leave %p\n", refs);
    return MPP_OK;
}